

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReadGIDGrid.cpp
# Opt level: O2

void __thiscall TPZReadGIDGrid::TPZReadGIDGrid(TPZReadGIDGrid *this)

{
  TPZStack<MaterialDataV,_10>::TPZStack(&this->fMaterialDataVec);
  TPZStack<MaterialDataV,_10>::TPZStack(&this->fBCMaterialDataVec);
  TPZStack<MaterialDataV,_10>::TPZStack(&this->fBCNodeDataVec);
  this->MatNumber = 0;
  this->BCNumber = 0;
  this->fProblemDimension = 0;
  this->fDimensionlessL = 1.0;
  return;
}

Assistant:

TPZReadGIDGrid::TPZReadGIDGrid() {
	MatNumber = 0;
	BCNumber = 0;
	fProblemDimension = 0;
	fDimensionlessL = 1.0;
}